

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O2

void __thiscall w3SourceGen::push_i32(w3SourceGen *this,int i)

{
  w3SourceGenValue sourceGenValue;
  char s [99];
  allocator<char> local_b1;
  undefined1 local_b0 [40];
  char local_88 [112];
  
  sprintf(local_88,"%d",i);
  local_b0[0] = Tag_i32;
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_b0 + 8),local_88,&local_b1);
  std::deque<w3SourceGenValue,_std::allocator<w3SourceGenValue>_>::push_back
            ((deque<w3SourceGenValue,_std::allocator<w3SourceGenValue>_> *)&this->stack,
             (value_type *)local_b0);
  std::__cxx11::string::~string((string *)(local_b0 + 8));
  return;
}

Assistant:

void push_i32 (int i)
    {
        char s[99];
        sprintf(s, "%d", i); // TODO C vs. Rust TODO perf
        w3SourceGenValue sourceGenValue = {Tag_i32, s};
        stack.push(sourceGenValue);
    }